

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_byte.hpp
# Opt level: O2

ans_byte_decode * ans_byte_decode::load(ans_byte_decode *__return_storage_ptr__,uint8_t *in_u8)

{
  uint uVar1;
  pointer pdVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  size_t sym;
  long lVar5;
  uint64_t uVar6;
  size_t sym_1;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  undefined1 auVar10 [64];
  undefined1 in_XMM1 [16];
  undefined1 extraout_var [56];
  
  memset(__return_storage_ptr__,0,0x400);
  (__return_storage_ptr__->table).super__Vector_base<dec_entry,_std::allocator<dec_entry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->table).super__Vector_base<dec_entry,_std::allocator<dec_entry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->table).super__Vector_base<dec_entry,_std::allocator<dec_entry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  interpolative_internal::decode((uint32_t *)in_u8,(uint32_t *)__return_storage_ptr__,0x100,0x1100);
  uVar4 = (__return_storage_ptr__->nfreqs)._M_elems[0];
  for (lVar5 = 1; lVar5 != 0x100; lVar5 = lVar5 + 1) {
    uVar1 = (__return_storage_ptr__->nfreqs)._M_elems[lVar5];
    (__return_storage_ptr__->nfreqs)._M_elems[lVar5] = ~uVar4 + uVar1;
    uVar4 = uVar1;
  }
  uVar6 = 0;
  for (lVar5 = 0; lVar5 != 0x400; lVar5 = lVar5 + 4) {
    uVar6 = uVar6 + *(uint *)((long)(__return_storage_ptr__->nfreqs)._M_elems + lVar5);
  }
  auVar3 = vcvtusi2sd_avx512f(in_XMM1,uVar6);
  __return_storage_ptr__->frame_size = uVar6;
  __return_storage_ptr__->frame_mask = uVar6 - 1;
  auVar10._0_8_ = log2(auVar3._0_8_);
  auVar10._8_56_ = extraout_var;
  uVar6 = vcvttsd2usi_avx512f(auVar10._0_16_);
  __return_storage_ptr__->frame_log2 = uVar6;
  std::vector<dec_entry,_std::allocator<dec_entry>_>::resize
            (&__return_storage_ptr__->table,__return_storage_ptr__->frame_size);
  uVar4 = 0;
  for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 1) {
    uVar1 = (__return_storage_ptr__->nfreqs)._M_elems[lVar5];
    pdVar2 = (__return_storage_ptr__->table).
             super__Vector_base<dec_entry,_std::allocator<dec_entry>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = 0;
    while (uVar7 = uVar8 & 0xffff, uVar7 < uVar1) {
      uVar9 = uVar7 + (uVar4 & 0xffff);
      pdVar2[uVar9].freq = (uint16_t)uVar1;
      pdVar2[uVar9].sym = (uint8_t)lVar5;
      pdVar2[uVar9].offset = (uint16_t)uVar8;
      uVar8 = uVar7 + 1;
    }
    uVar4 = uVar4 + uVar1;
  }
  __return_storage_ptr__->lower_bound = __return_storage_ptr__->frame_size << 4;
  return __return_storage_ptr__;
}

Assistant:

static ans_byte_decode load(const uint8_t* in_u8)
    {
        ans_byte_decode model;
        auto in_ptr_u32 = reinterpret_cast<const uint32_t*>(in_u8);
        std::array<uint32_t, constants::MAX_SIGMA> efreqs;
        interpolative_internal::decode(in_ptr_u32, model.nfreqs.data(),
            constants::MAX_SIGMA,
            constants::MAX_FRAME_SIZE + constants::MAX_SIGMA);
        uint32_t prev = model.nfreqs[0];
        for (size_t sym = 1; sym < constants::MAX_SIGMA; sym++) {
            auto cur = model.nfreqs[sym];
            model.nfreqs[sym] = cur - prev - 1;
            prev = cur;
        }
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0ULL);
        model.frame_mask = model.frame_size - 1;
        model.frame_log2 = log2(model.frame_size);
        model.table.resize(model.frame_size);
        uint64_t tmp = constants::K * constants::RADIX;
        uint16_t cur_base = 0;
        for (size_t sym = 0; sym < constants::MAX_SIGMA; sym++) {
            auto cur_freq = model.nfreqs[sym];
            for (uint16_t k = 0; k < cur_freq; k++) {
                model.table[cur_base + k].freq = cur_freq;
                model.table[cur_base + k].sym = sym;
                model.table[cur_base + k].offset = k;
            }
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }